

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void ipred_hor_uv(pel *src,pel *dst,int i_dst,int w,int h)

{
  undefined2 uVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < h) {
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar1 = *(undefined2 *)src;
        uVar3 = 0;
        do {
          *(undefined2 *)(dst + uVar3 * 2) = uVar1;
          uVar3 = uVar3 + 1;
        } while ((uint)w != uVar3);
      }
      dst = dst + i_dst;
      src = src + -2;
      iVar2 = iVar2 + 1;
    } while (iVar2 != h);
  }
  return;
}

Assistant:

void ipred_hor_uv(pel *src, pel *dst, int i_dst, int w, int h)
{
    int i;
    int shift = sizeof(pel) * 8;
    
    for (i = 0; i < h; i++) {
        int uv_pixel = (src[1] << shift) + src[0];
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
        src -= 2;
    }
}